

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall kj::anon_unknown_36::WebSocketPipeImpl::Aborted::close(Aborted *this,int __fd)

{
  char (*in_RCX) [41];
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[41]>
            ((String *)&local_1c0,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_1a8,DISCONNECTED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x113f,(String *)&local_1c0);
  Promise<void>::Promise((Promise<void> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }